

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram-cache.cpp
# Opt level: O0

llama_token
try_draft(common_ngram_cache *nc_primary,
         vector<common_ngram,_std::allocator<common_ngram>_> *ngrams_primary,
         common_ngram_cache_part *part_static,int *min_sample_size,int *min_percent)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference __p;
  pointer ppVar4;
  long in_RCX;
  vector<common_ngram,_std::allocator<common_ngram>_> *in_RSI;
  long in_R8;
  int32_t count_static;
  int32_t count_primary;
  iterator token_count_static_it;
  llama_token token;
  pair<int,_int> token_count_primary;
  const_iterator __end2;
  const_iterator __begin2;
  common_ngram_cache_part *__range2;
  llama_token max_token;
  int sum_count_primary;
  int max_count_static;
  int max_count_primary;
  common_ngram_cache_part part_primary;
  iterator part_primary_it;
  common_ngram ngram_primary;
  int i;
  llama_token drafted_token;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  _Node_iterator_base<std::pair<const_int,_int>,_false> in_stack_ffffffffffffff10;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_e0;
  int local_d8;
  int local_d4;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_d0;
  int local_c8;
  pair<int,_int> local_b8;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_b0;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_a8;
  undefined1 *local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  undefined1 local_88 [56];
  _Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
  local_50;
  _Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
  local_48;
  undefined8 local_40;
  undefined8 local_38;
  int local_30;
  int local_2c;
  long local_28;
  long local_20;
  vector<common_ngram,_std::allocator<common_ngram>_> *local_10;
  
  local_2c = -1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  sVar2 = std::vector<common_ngram,_std::allocator<common_ngram>_>::size(in_RSI);
  local_30 = (int)sVar2;
  while (local_30 = local_30 + -1, -1 < local_30 && local_2c == -1) {
    pvVar3 = std::vector<common_ngram,_std::allocator<common_ngram>_>::operator[]
                       (local_10,(long)local_30);
    local_40 = *(undefined8 *)pvVar3->tokens;
    local_38 = *(undefined8 *)(pvVar3->tokens + 2);
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_common_ngram_hash_function,_std::equal_to<common_ngram>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
         ::find((unordered_map<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_common_ngram_hash_function,_std::equal_to<common_ngram>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                (key_type *)0x362a5f);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_common_ngram_hash_function,_std::equal_to<common_ngram>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
         ::end((unordered_map<common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_common_ngram_hash_function,_std::equal_to<common_ngram>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    bVar1 = std::__detail::operator==(&local_48,&local_50);
    if (!bVar1) {
      std::__detail::
      _Node_iterator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_false,_true>
      ::operator->((_Node_iterator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_false,_true>
                    *)0x362aa9);
      std::
      unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)in_stack_ffffffffffffff10._M_cur,
                      (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      local_8c = 0;
      local_90 = 0;
      local_94 = 0;
      local_98 = -1;
      local_a0 = local_88;
      local_a8._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
           ::begin((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      local_b0._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
           ::end((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      while (bVar1 = std::__detail::operator!=(&local_a8,&local_b0), bVar1) {
        __p = std::__detail::_Node_const_iterator<std::pair<const_int,_int>,_false,_false>::
              operator*((_Node_const_iterator<std::pair<const_int,_int>,_false,_false> *)0x362b24);
        std::pair<int,_int>::pair<const_int,_int,_true>(&local_b8,__p);
        local_c8 = local_b8.first;
        in_stack_ffffffffffffff10._M_cur =
             (__node_type *)
             std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::find((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                    (key_type *)0x362b4d);
        local_d4 = local_b8.second;
        local_d0._M_cur = in_stack_ffffffffffffff10._M_cur;
        local_e0._M_cur =
             (__node_type *)
             std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::end((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        bVar1 = std::__detail::operator!=(&local_d0,&local_e0);
        if (bVar1) {
          ppVar4 = std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>::
                   operator->((_Node_iterator<std::pair<const_int,_int>,_false,_false> *)0x362b97);
          in_stack_ffffffffffffff0c = ppVar4->second * 100;
        }
        else {
          in_stack_ffffffffffffff0c = 1;
        }
        if (local_8c * local_90 < local_d4 * in_stack_ffffffffffffff0c) {
          local_98 = local_c8;
          local_8c = local_d4;
          local_90 = in_stack_ffffffffffffff0c;
        }
        local_94 = local_d4 + local_94;
        local_d8 = in_stack_ffffffffffffff0c;
        std::__detail::_Node_const_iterator<std::pair<const_int,_int>,_false,_false>::operator++
                  ((_Node_const_iterator<std::pair<const_int,_int>,_false,_false> *)
                   in_stack_ffffffffffffff10._M_cur);
      }
      if ((*(int *)(local_20 + (long)local_30 * 4) <= local_94) &&
         (*(int *)(local_28 + (long)local_30 * 4) * local_94 <= local_8c * 100)) {
        local_2c = local_98;
      }
      std::
      unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                        *)0x362c87);
    }
  }
  return local_2c;
}

Assistant:

static llama_token try_draft(
    common_ngram_cache & nc_primary, const std::vector<common_ngram> & ngrams_primary, common_ngram_cache_part & part_static,
    const int * min_sample_size, const int * min_percent) {

    llama_token drafted_token = LLAMA_TOKEN_NULL;

    for (int i = ngrams_primary.size()-1; i >= 0 && drafted_token == LLAMA_TOKEN_NULL; --i) {
        const common_ngram ngram_primary = ngrams_primary[i];

        common_ngram_cache::iterator part_primary_it = nc_primary.find(ngram_primary);
        if (part_primary_it == nc_primary.end()) {
            continue;
        }
        const common_ngram_cache_part part_primary = part_primary_it->second;

        int max_count_primary = 0;
        int max_count_static  = 0;
        int sum_count_primary = 0;
        llama_token max_token = LLAMA_TOKEN_NULL;

        for (std::pair<llama_token, int> token_count_primary : part_primary) {
            const llama_token token = token_count_primary.first;

            common_ngram_cache_part::iterator token_count_static_it = part_static.find(token);

            const int32_t count_primary = token_count_primary.second;
            const int32_t count_static  = token_count_static_it != part_static.end() ? 100*token_count_static_it->second : 1;

            if (count_primary*count_static > max_count_primary*max_count_static) {
                max_token         = token;
                max_count_primary = count_primary;
                max_count_static  = count_static;
            }
            sum_count_primary += count_primary;
        }

        if (sum_count_primary < min_sample_size[i]) {
            continue;
        }
        if (100*max_count_primary < min_percent[i]*sum_count_primary) {
            continue;;
        }
        drafted_token = max_token;
    }

    return drafted_token;
}